

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tst_serialiserscommon.cpp
# Opt level: O3

void __thiscall tst_SerialiserCommon::basicSaveLoadData(tst_SerialiserCommon *this,QObject *parent)

{
  __atomic_base<int> _Var1;
  QTestData *pQVar2;
  QStringListModel *this_00;
  QStandardItemModel *pQVar3;
  QMetaTypeInterface *local_38;
  QStringListModel *local_30;
  
  local_38 = &QtPrivate::QMetaTypeInterfaceWrapper<const_QAbstractItemModel_*>::metaType;
  _Var1._M_i = (__int_type)
               QtPrivate::QMetaTypeInterfaceWrapper<const_QAbstractItemModel_*>::metaType.typeId.
               _q_value.super___atomic_base<int>._M_i;
  if ((__atomic_base<int>)
      QtPrivate::QMetaTypeInterfaceWrapper<const_QAbstractItemModel_*>::metaType.typeId._q_value.
      super___atomic_base<int>._M_i == (__atomic_base<int>)0x0) {
    _Var1._M_i = QMetaType::idHelper();
  }
  QTest::addColumnInternal(_Var1._M_i,"sourceModel");
  local_38 = &QtPrivate::QMetaTypeInterfaceWrapper<QAbstractItemModel_*>::metaType;
  _Var1._M_i = (__int_type)
               QtPrivate::QMetaTypeInterfaceWrapper<QAbstractItemModel_*>::metaType.typeId;
  if ((__atomic_base<int>)
      QtPrivate::QMetaTypeInterfaceWrapper<QAbstractItemModel_*>::metaType.typeId._q_value.
      super___atomic_base<int>._M_i == (__atomic_base<int>)0x0) {
    _Var1._M_i = QMetaType::idHelper();
  }
  QTest::addColumnInternal(_Var1._M_i,"destinationModel");
  pQVar2 = (QTestData *)QTest::newRow("List Single Role");
  local_38 = (QMetaTypeInterface *)createStringModel(this,parent);
  pQVar2 = operator<<(pQVar2,(QAbstractItemModel **)&local_38);
  this_00 = (QStringListModel *)operator_new(0x28);
  QStringListModel::QStringListModel(this_00,parent);
  local_30 = this_00;
  operator<<(pQVar2,(QAbstractItemModel **)&local_30);
  pQVar2 = (QTestData *)QTest::newRow("List Single Role Overwrite");
  local_38 = (QMetaTypeInterface *)createStringModel(this,parent);
  pQVar2 = operator<<(pQVar2,(QAbstractItemModel **)&local_38);
  local_30 = (QStringListModel *)createStringModel(this,parent);
  operator<<(pQVar2,(QAbstractItemModel **)&local_30);
  pQVar2 = (QTestData *)QTest::newRow("Table Single Role");
  local_38 = (QMetaTypeInterface *)createComplexModel(this,false,false,parent);
  pQVar2 = operator<<(pQVar2,(QAbstractItemModel **)&local_38);
  pQVar3 = (QStandardItemModel *)operator_new(0x10);
  QStandardItemModel::QStandardItemModel(pQVar3,parent);
  local_30 = (QStringListModel *)pQVar3;
  operator<<(pQVar2,(QAbstractItemModel **)&local_30);
  pQVar2 = (QTestData *)QTest::newRow("Table Multi Roles");
  local_38 = (QMetaTypeInterface *)createComplexModel(this,false,true,parent);
  pQVar2 = operator<<(pQVar2,(QAbstractItemModel **)&local_38);
  pQVar3 = (QStandardItemModel *)operator_new(0x10);
  QStandardItemModel::QStandardItemModel(pQVar3,parent);
  local_30 = (QStringListModel *)pQVar3;
  operator<<(pQVar2,(QAbstractItemModel **)&local_30);
  pQVar2 = (QTestData *)QTest::newRow("Table Single Role Overwrite");
  local_38 = (QMetaTypeInterface *)createComplexModel(this,false,false,parent);
  pQVar2 = operator<<(pQVar2,(QAbstractItemModel **)&local_38);
  local_30 = (QStringListModel *)createComplexModel(this,false,false,parent);
  operator<<(pQVar2,(QAbstractItemModel **)&local_30);
  pQVar2 = (QTestData *)QTest::newRow("Table Multi Roles Overwrite");
  local_38 = (QMetaTypeInterface *)createComplexModel(this,false,true,parent);
  pQVar2 = operator<<(pQVar2,(QAbstractItemModel **)&local_38);
  local_30 = (QStringListModel *)createComplexModel(this,false,true,parent);
  operator<<(pQVar2,(QAbstractItemModel **)&local_30);
  pQVar2 = (QTestData *)QTest::newRow("Tree Single Role");
  local_38 = (QMetaTypeInterface *)createComplexModel(this,true,false,parent);
  pQVar2 = operator<<(pQVar2,(QAbstractItemModel **)&local_38);
  pQVar3 = (QStandardItemModel *)operator_new(0x10);
  QStandardItemModel::QStandardItemModel(pQVar3,parent);
  local_30 = (QStringListModel *)pQVar3;
  operator<<(pQVar2,(QAbstractItemModel **)&local_30);
  pQVar2 = (QTestData *)QTest::newRow("Tree Multi Roles");
  local_38 = (QMetaTypeInterface *)createComplexModel(this,true,true,parent);
  pQVar2 = operator<<(pQVar2,(QAbstractItemModel **)&local_38);
  pQVar3 = (QStandardItemModel *)operator_new(0x10);
  QStandardItemModel::QStandardItemModel(pQVar3,parent);
  local_30 = (QStringListModel *)pQVar3;
  operator<<(pQVar2,(QAbstractItemModel **)&local_30);
  pQVar2 = (QTestData *)QTest::newRow("Tree Single Role Overwrite");
  local_38 = (QMetaTypeInterface *)createComplexModel(this,true,false,parent);
  pQVar2 = operator<<(pQVar2,(QAbstractItemModel **)&local_38);
  local_30 = (QStringListModel *)createComplexModel(this,true,false,parent);
  operator<<(pQVar2,(QAbstractItemModel **)&local_30);
  pQVar2 = (QTestData *)QTest::newRow("Tree Multi Roles Overwrite");
  local_38 = (QMetaTypeInterface *)createComplexModel(this,true,true,parent);
  pQVar2 = operator<<(pQVar2,(QAbstractItemModel **)&local_38);
  local_30 = (QStringListModel *)createComplexModel(this,true,true,parent);
  operator<<(pQVar2,(QAbstractItemModel **)&local_30);
  return;
}

Assistant:

void tst_SerialiserCommon::basicSaveLoadData(QObject *parent)
{
    QTest::addColumn<const QAbstractItemModel *>("sourceModel");
    QTest::addColumn<QAbstractItemModel *>("destinationModel");
    QTest::newRow("List Single Role") << static_cast<const QAbstractItemModel *>(createStringModel(parent))
                                      << static_cast<QAbstractItemModel *>(new QStringListModel(parent));
    QTest::newRow("List Single Role Overwrite") << static_cast<const QAbstractItemModel *>(createStringModel(parent)) << createStringModel(parent);
#ifdef COMPLEX_MODEL_SUPPORT
    QTest::newRow("Table Single Role") << static_cast<const QAbstractItemModel *>(createComplexModel(false, false, parent))
                                       << static_cast<QAbstractItemModel *>(new ComplexModel(parent));
    QTest::newRow("Table Multi Roles") << static_cast<const QAbstractItemModel *>(createComplexModel(false, true, parent))
                                       << static_cast<QAbstractItemModel *>(new ComplexModel(parent));
    QTest::newRow("Table Single Role Overwrite") << static_cast<const QAbstractItemModel *>(createComplexModel(false, false, parent))
                                                 << createComplexModel(false, false, parent);
    QTest::newRow("Table Multi Roles Overwrite") << static_cast<const QAbstractItemModel *>(createComplexModel(false, true, parent))
                                                 << createComplexModel(false, true, parent);
    QTest::newRow("Tree Single Role") << static_cast<const QAbstractItemModel *>(createComplexModel(true, false, parent))
                                      << static_cast<QAbstractItemModel *>(new ComplexModel(parent));
    QTest::newRow("Tree Multi Roles") << static_cast<const QAbstractItemModel *>(createComplexModel(true, true, parent))
                                      << static_cast<QAbstractItemModel *>(new ComplexModel(parent));
    QTest::newRow("Tree Single Role Overwrite") << static_cast<const QAbstractItemModel *>(createComplexModel(true, false, parent))
                                                << createComplexModel(true, false, parent);
    QTest::newRow("Tree Multi Roles Overwrite") << static_cast<const QAbstractItemModel *>(createComplexModel(true, true, parent))
                                                << createComplexModel(true, true, parent);
#endif
}